

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cxx
# Opt level: O2

string * zmq_recv_abi_cxx11_(string *__return_storage_ptr__,socket_t *socket)

{
  void *pvVar1;
  size_t sVar2;
  size_t in_RCX;
  int in_R8D;
  message_t msg;
  message_t mStack_58;
  
  zmq::message_t::message_t(&mStack_58);
  zmq::detail::socket_base::recv
            (&socket->super_socket_base,(int)&mStack_58,(void *)0x0,in_RCX,in_R8D);
  pvVar1 = zmq::message_t::data(&mStack_58);
  sVar2 = zmq::message_t::size(&mStack_58);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pvVar1,sVar2 + (long)pvVar1);
  zmq::message_t::~message_t(&mStack_58);
  return __return_storage_ptr__;
}

Assistant:

std::string zmq_recv(zmq::socket_t &socket) {
    zmq::message_t msg;
    socket.recv(&msg);

    return std::string(static_cast<char*>(msg.data()), msg.size());
}